

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCArray NULLC::LongToStr(longlong *r)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  NULLCArray NVar8;
  char buf [32];
  
  if (r == (longlong *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar8 = (NULLCArray)ZEXT812(0);
  }
  else {
    lVar2 = *r;
    cVar3 = (char)(lVar2 % 10);
    cVar4 = -cVar3;
    if (0 < (int)(lVar2 % 10)) {
      cVar4 = cVar3;
    }
    buf[0] = cVar4 + '0';
    lVar5 = lVar2;
    pcVar6 = buf;
    while (pcVar7 = pcVar6 + 1, 0x12 < lVar5 + 9U) {
      lVar5 = lVar5 / 10;
      cVar3 = (char)(lVar5 % 10);
      cVar4 = -cVar3;
      if (0 < (int)(lVar5 % 10)) {
        cVar4 = cVar3;
      }
      *pcVar7 = cVar4 + '0';
      pcVar6 = pcVar7;
    }
    if (lVar2 < 0) {
      *pcVar7 = '-';
      pcVar7 = pcVar6 + 2;
    }
    NVar8 = AllocArray(1,((int)pcVar7 - (int)buf) + 1,2);
    pcVar6 = NVar8.ptr;
    do {
      pcVar1 = pcVar7 + -1;
      pcVar7 = pcVar7 + -1;
      *pcVar6 = *pcVar1;
      pcVar6 = pcVar6 + 1;
    } while (pcVar7 != buf);
  }
  return NVar8;
}

Assistant:

NULLCArray NULLC::LongToStr(long long* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	long long number = *r;
	bool sign = 0;
	char buf[32];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(int(number % 10)) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(int(number % 10)) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}